

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O3

TPZAutoPointer<TPZMatrix<std::complex<float>_>_> __thiscall
TPZSTShiftOrigin<std::complex<float>_>::CalcMatrix
          (TPZSTShiftOrigin<std::complex<float>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *A,
          TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *B)

{
  atomic_int *paVar1;
  TPZSpectralTransform<std::complex<float>_> TVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  undefined8 *in_RCX;
  long lVar6;
  undefined8 uVar7;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar5 = (**(code **)(**(long **)*in_RCX + 0x80))();
  (**(code **)((ulong)(iVar5 != 0) * 0x20 + 0xb8 + **(long **)*in_RCX))();
  TVar2 = (TPZSpectralTransform<std::complex<float>_>)B->fRef;
  this->super_TPZSpectralTransform<std::complex<float>_> = TVar2;
  LOCK();
  paVar1 = (atomic_int *)((long)TVar2 + 8);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  lVar3 = (B->fRef->fPointer->super_TPZBaseMatrix).fRow;
  if (0 < lVar3) {
    local_48 = A[1].fRef;
    uStack_40 = 0;
    TVar2 = this->super_TPZSpectralTransform<std::complex<float>_>;
    lVar6 = 0;
    do {
      plVar4 = *(long **)TVar2;
      uVar7 = (**(code **)(*plVar4 + 0x120))(plVar4,lVar6,lVar6);
      local_50 = CONCAT44((float)((ulong)uVar7 >> 0x20) - local_48._4_4_,
                          (float)uVar7 - (float)local_48);
      (**(code **)(*plVar4 + 0x118))(plVar4,lVar6,lVar6,&local_50);
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  return (TPZAutoPointer<TPZMatrix<std::complex<float>_>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  if (B->IsSymmetric()) B->Decompose_LDLt();
  else B->Decompose_LU();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //b-1 * shiftedA will be computed at the arnoldi iteration
  const auto &shift = Shift();
  const auto nRows = A->Rows();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}